

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O2

int bootchart_step(void)

{
  int iVar1;
  uint len;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  size_t sVar4;
  char *__s;
  char *__s_00;
  char *end;
  char filename [32];
  char buff [1024];
  char local_438 [1032];
  
  do_log_file(log_stat,"/proc/stat");
  do_log_file(log_disks,"/proc/diskstats");
  __dirp = opendir("/proc");
  do_log_uptime(log_procs);
  while( true ) {
    pdVar2 = readdir(__dirp);
    if (pdVar2 == (dirent *)0x0) break;
    uVar3 = strtol(pdVar2->d_name,&end,10);
    if ((pdVar2->d_name < end) && (*end == '\0')) {
      snprintf(filename,0x20,"/proc/%d/cmdline",uVar3 & 0xffffffff);
      proc_read(filename,local_438,0x400);
      snprintf(filename,0x20,"/proc/%d/stat",uVar3 & 0xffffffff);
      iVar1 = open(filename,0);
      if (-1 < iVar1) {
        len = unix_read(iVar1,buff,0x3ff);
        close(iVar1);
        if (0 < (int)len) {
          sVar4 = strlen(local_438);
          if ((int)sVar4 < 1) {
            __s_00 = buff;
          }
          else {
            buff[len] = '\0';
            __s = strchr(buff,0x28);
            __s_00 = strchr(__s,0x29);
            file_buff_write(log_procs,buff,((int)__s - (int)buff) + 1);
            file_buff_write(log_procs,local_438,(int)sVar4);
            sVar4 = strlen(__s_00);
            len = (uint)sVar4;
          }
          file_buff_write(log_procs,__s_00,len);
        }
      }
    }
  }
  closedir(__dirp);
  do_log_ln(log_procs);
  iVar1 = proc_read("/var/log/bootchart-stop",buff,2);
  return -(uint)(buff[0] == '1' && 0 < iVar1);
}

Assistant:

int  bootchart_step( void )
{
    do_log_file(log_stat,   "/proc/stat");
    do_log_file(log_disks,  "/proc/diskstats");
    do_log_procs(log_procs);

    /* we stop when /data/bootchart-stop contains 1 */
    {
        char  buff[2];
        if (proc_read(LOG_STOPFILE,buff,sizeof(buff)) > 0 && buff[0] == '1') {
            return -1;
        }
    }

    return 0;
}